

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O0

Message * __thiscall
google::protobuf::DynamicMessageFactory::GetPrototypeNoLock
          (DynamicMessageFactory *this,Descriptor *type)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint *puVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  FileDescriptor *pFVar8;
  DescriptorPool *pDVar9;
  DescriptorPool *pDVar10;
  Message *pMVar11;
  TypeInfo *this_00;
  ulong uVar12;
  type puVar13;
  FieldDescriptor *pFVar14;
  int *piVar15;
  OneofDescriptor *pOVar16;
  char *pcVar17;
  DynamicMessage *this_01;
  Reflection *this_02;
  int __c;
  DescriptorPool *local_120;
  undefined1 local_100 [8];
  ReflectionSchema schema;
  DynamicMessage *prototype;
  void *base;
  FieldDescriptor *field_1;
  int j_1;
  int i_3;
  anon_union_8_2_c1fe21fb_for_MessageCreator_4 local_90;
  int local_84;
  int local_80;
  int i_2;
  int field_size;
  int i_1;
  int has_bits_array_size;
  int j;
  uint32_t *has_bits_indices;
  FieldDescriptor *field;
  uint local_58;
  int i;
  int max_hasbit;
  int size;
  uint32_t *offsets;
  int real_oneof_count;
  TypeInfo *local_38;
  TypeInfo *type_info;
  TypeInfo **target;
  Message *result;
  Descriptor *type_local;
  DynamicMessageFactory *this_local;
  
  result = (Message *)type;
  type_local = (Descriptor *)this;
  if ((this->delegate_to_generated_factory_ & 1U) != 0) {
    pFVar8 = Descriptor::file(type);
    pDVar9 = FileDescriptor::pool(pFVar8);
    pDVar10 = DescriptorPool::generated_pool();
    if (pDVar9 == pDVar10) {
      pMVar11 = MessageFactory::TryGetGeneratedPrototype((Descriptor *)result);
      if (pMVar11 != (Message *)0x0) {
        return pMVar11;
      }
      target = (TypeInfo **)0x0;
    }
  }
  type_info = (TypeInfo *)
              absl::lts_20250127::container_internal::
              raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::DynamicMessageFactory::TypeInfo_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::DynamicMessageFactory::TypeInfo_const*>>>
              ::
              operator[]<google::protobuf::Descriptor_const*,absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::DynamicMessageFactory::TypeInfo_const*>>
                        ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::DynamicMessageFactory::TypeInfo_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::DynamicMessageFactory::TypeInfo_const*>>>
                          *)&this->prototypes_,
                         (key_arg<const_google::protobuf::Descriptor_*> *)&result);
  if (*(TypeInfo **)type_info == (TypeInfo *)0x0) {
    this_00 = (TypeInfo *)operator_new(0xa0);
    TypeInfo::TypeInfo(this_00);
    *(TypeInfo **)type_info = this_00;
    (this_00->class_data).descriptor = (Descriptor *)result;
    (this_00->class_data).super_ClassData.is_dynamic = true;
    local_38 = this_00;
    if (this->pool_ == (DescriptorPool *)0x0) {
      pFVar8 = Descriptor::file((Descriptor *)result);
      local_120 = FileDescriptor::pool(pFVar8);
    }
    else {
      local_120 = this->pool_;
    }
    local_38->pool = local_120;
    local_38->factory = this;
    offsets._0_4_ = Descriptor::real_oneof_decl_count((Descriptor *)result);
    iVar5 = Descriptor::field_count((Descriptor *)result);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)(iVar5 + (int)offsets);
    uVar12 = SUB168(auVar1 * ZEXT816(4),0);
    if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
      uVar12 = 0xffffffffffffffff;
    }
    _max_hasbit = (uint *)operator_new__(uVar12);
    std::unique_ptr<unsigned_int[],std::default_delete<unsigned_int[]>>::reset<unsigned_int*,void>
              ((unique_ptr<unsigned_int[],std::default_delete<unsigned_int[]>> *)&local_38->offsets,
               _max_hasbit);
    i = 0x20;
    i = anon_unknown_0::AlignOffset(0x20);
    local_38->has_bits_offset = -1;
    local_58 = 0;
    for (field._4_4_ = 0; iVar5 = field._4_4_, iVar6 = Descriptor::field_count((Descriptor *)result)
        , iVar5 < iVar6; field._4_4_ = field._4_4_ + 1) {
      has_bits_indices = (uint32_t *)Descriptor::field((Descriptor *)result,field._4_4_);
      bVar4 = internal::cpp::HasHasbit((FieldDescriptor *)has_bits_indices);
      if ((bVar4) &&
         ((bVar4 = FieldDescriptor::has_presence((FieldDescriptor *)has_bits_indices), bVar4 ||
          (bVar4 = anon_unknown_0::IsMapEntryField((FieldDescriptor *)has_bits_indices), !bVar4))))
      {
        if (local_38->has_bits_offset == -1) {
          local_38->has_bits_offset = i;
          iVar5 = Descriptor::field_count((Descriptor *)result);
          auVar2._8_8_ = 0;
          auVar2._0_8_ = (long)iVar5;
          uVar12 = SUB168(auVar2 * ZEXT816(4),0);
          if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
            uVar12 = 0xffffffffffffffff;
          }
          _has_bits_array_size = (uint *)operator_new__(uVar12);
          for (i_1 = 0; iVar5 = i_1, iVar6 = Descriptor::field_count((Descriptor *)result),
              iVar5 < iVar6; i_1 = i_1 + 1) {
            _has_bits_array_size[i_1] = 0xffffffff;
          }
          std::unique_ptr<unsigned_int[],std::default_delete<unsigned_int[]>>::
          reset<unsigned_int*,void>
                    ((unique_ptr<unsigned_int[],std::default_delete<unsigned_int[]>> *)
                     &local_38->has_bits_indices,_has_bits_array_size);
        }
        uVar7 = local_58;
        local_58 = local_58 + 1;
        puVar13 = std::unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>::operator[]
                            (&local_38->has_bits_indices,(long)field._4_4_);
        *puVar13 = uVar7;
      }
    }
    if (0 < (int)local_58) {
      field_size = anon_unknown_0::DivideRoundingUp(local_58,0x20);
      i = i + field_size * 4;
      i = anon_unknown_0::AlignOffset(i);
    }
    if (0 < (int)offsets) {
      local_38->oneof_case_offset = i;
      i = i + (int)offsets * 4;
      i = anon_unknown_0::AlignOffset(i);
    }
    iVar5 = Descriptor::extension_range_count((Descriptor *)result);
    if (iVar5 < 1) {
      local_38->extensions_offset = -1;
    }
    else {
      local_38->extensions_offset = i;
      i = i + 0x18;
      i = anon_unknown_0::AlignOffset(i);
    }
    for (i_2 = 0; iVar5 = i_2, iVar6 = Descriptor::field_count((Descriptor *)result), iVar5 < iVar6;
        i_2 = i_2 + 1) {
      pFVar14 = Descriptor::field((Descriptor *)result,i_2);
      bVar4 = anon_unknown_0::InRealOneof(pFVar14);
      if (!bVar4) {
        pFVar14 = Descriptor::field((Descriptor *)result,i_2);
        local_80 = anon_unknown_0::FieldSpaceUsed(pFVar14);
        iVar5 = i;
        piVar15 = std::min<int>(&protobuf::(anonymous_namespace)::kSafeAlignment,&local_80);
        uVar7 = anon_unknown_0::AlignTo(iVar5,*piVar15);
        _max_hasbit[i_2] = uVar7;
        i = local_80 + uVar7;
      }
    }
    for (local_84 = 0; iVar5 = local_84,
        iVar6 = Descriptor::real_oneof_decl_count((Descriptor *)result), iVar5 < iVar6;
        local_84 = local_84 + 1) {
      uVar7 = anon_unknown_0::AlignTo(i,8);
      puVar3 = _max_hasbit;
      i = uVar7;
      iVar5 = Descriptor::field_count((Descriptor *)result);
      puVar3[iVar5 + local_84] = uVar7;
      i = i + 8;
    }
    local_38->weak_field_map_offset = -1;
    internal::MessageCreator::MessageCreator((MessageCreator *)&j_1,DynamicMessage::NewImpl,i,'\b');
    (local_38->class_data).super_ClassData.message_creator.allocation_size_ = j_1;
    (local_38->class_data).super_ClassData.message_creator.tag_ = (Tag)i_3;
    (local_38->class_data).super_ClassData.message_creator.alignment_ = i_3._1_1_;
    *(undefined2 *)&(local_38->class_data).super_ClassData.message_creator.field_0x6 = i_3._2_2_;
    (local_38->class_data).super_ClassData.message_creator.field_3 = local_90;
    for (field_1._4_4_ = 0; iVar5 = Descriptor::real_oneof_decl_count((Descriptor *)result),
        field_1._4_4_ < iVar5; field_1._4_4_ = field_1._4_4_ + 1) {
      field_1._0_4_ = 0;
      while( true ) {
        pOVar16 = Descriptor::real_oneof_decl((Descriptor *)result,field_1._4_4_);
        iVar5 = OneofDescriptor::field_count(pOVar16);
        if (iVar5 <= (int)(uint)field_1) break;
        pOVar16 = Descriptor::real_oneof_decl((Descriptor *)result,field_1._4_4_);
        pcVar17 = (char *)(ulong)(uint)field_1;
        pFVar14 = OneofDescriptor::field(pOVar16,(uint)field_1);
        puVar3 = _max_hasbit;
        pcVar17 = FieldDescriptor::index(pFVar14,pcVar17,__c);
        puVar3[(int)pcVar17] = 0x40000000;
        field_1._0_4_ = (uint)field_1 + 1;
      }
    }
    this_01 = (DynamicMessage *)operator_new((long)i);
    memset(this_01,0,(long)i);
    DynamicMessage::DynamicMessage(this_01,local_38,false);
    local_100 = (undefined1  [8])(local_38->class_data).super_ClassData.prototype;
    schema._64_8_ = this_01;
    schema.default_instance_ =
         (Message *)
         std::unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>::get
                   (&local_38->offsets);
    schema.offsets_ =
         std::unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>::get
                   (&local_38->has_bits_indices);
    schema.has_bit_indices_._0_4_ = local_38->has_bits_offset;
    schema.has_bit_indices_._4_4_ = local_38->extensions_offset;
    schema.has_bits_offset_ = local_38->oneof_case_offset;
    schema.extensions_offset_ =
         internal::ClassData::allocation_size(&(local_38->class_data).super_ClassData);
    schema.oneof_case_offset_ = local_38->weak_field_map_offset;
    schema.weak_field_map_offset_ = 0;
    schema._44_4_ = 0;
    schema.inlined_string_indices_._0_4_ = 0;
    schema.inlined_string_indices_._4_4_ = 0xffffffff;
    schema.inlined_string_donated_offset_ = -1;
    this_02 = (Reflection *)operator_new(0x70);
    Reflection::Reflection
              (this_02,(local_38->class_data).descriptor,(ReflectionSchema *)local_100,
               local_38->pool,&this->super_MessageFactory);
    (local_38->class_data).reflection = this_02;
    DynamicMessage::CrossLinkPrototypes((DynamicMessage *)schema._64_8_);
    this_local = (DynamicMessageFactory *)schema._64_8_;
  }
  else {
    this_local = (DynamicMessageFactory *)
                 ((*(TypeInfo **)type_info)->class_data).super_ClassData.prototype;
  }
  return (Message *)this_local;
}

Assistant:

const Message* DynamicMessageFactory::GetPrototypeNoLock(
    const Descriptor* PROTOBUF_NONNULL type) {
  if (delegate_to_generated_factory_ &&
      type->file()->pool() == DescriptorPool::generated_pool()) {
    const Message* result = MessageFactory::TryGetGeneratedPrototype(type);
    if (result != nullptr) return result;
    // Otherwise, we will create it dynamically so keep going.
  }

  const TypeInfo** target = &prototypes_[type];
  if (*target != nullptr) {
    // Already exists.
    return static_cast<const Message*>((*target)->class_data.prototype);
  }

  TypeInfo* type_info = new TypeInfo;
  *target = type_info;

  type_info->class_data.descriptor = type;
  type_info->class_data.is_dynamic = true;
  type_info->pool = (pool_ == nullptr) ? type->file()->pool() : pool_;
  type_info->factory = this;

  // We need to construct all the structures passed to Reflection's constructor.
  // This includes:
  // - A block of memory that contains space for all the message's fields.
  // - An array of integers indicating the byte offset of each field within
  //   this block.
  // - A big bitfield containing a bit for each field indicating whether
  //   or not that field is set.
  int real_oneof_count = type->real_oneof_decl_count();

  // Compute size and offsets.
  uint32_t* offsets = new uint32_t[type->field_count() + real_oneof_count];
  type_info->offsets.reset(offsets);

  // Decide all field offsets by packing in order.
  // We place the DynamicMessage object itself at the beginning of the allocated
  // space.
  int size = sizeof(DynamicMessage);
  size = AlignOffset(size);

  // Next the has_bits, which is an array of uint32s.
  type_info->has_bits_offset = -1;
  int max_hasbit = 0;
  for (int i = 0; i < type->field_count(); i++) {
    const FieldDescriptor* field = type->field(i);

    // If a field has hasbits, it could be either an explicit-presence or
    // implicit-presence field. Explicit presence fields will have "true
    // hasbits" where hasbit is set iff field is present. Implicit presence
    // fields will have "hint hasbits" where
    // - if hasbit is unset, field is not present.
    // - if hasbit is set, field is present if it is also nonempty.
    if (internal::cpp::HasHasbit(field)) {
      // TODO: b/112602698 - during Python textproto serialization, MapEntry
      // messages may be generated from DynamicMessage on the fly. C++
      // implementations of MapEntry messages always have hasbits, but
      // has_presence return values might be different depending on how field
      // presence is set. For MapEntrys, has_presence returns true for
      // explicit-presence (proto2) messages and returns false for
      // implicit-presence (proto3) messages.
      //
      // In the case of implicit presence, there is a potential inconsistency in
      // code behavior between C++ and Python:
      // - If C++ implementation is linked, hasbits are always generated for
      //   MapEntry messages, and MapEntry messages will behave like explicit
      //   presence.
      // - If C++ implementation is not linked, Python defaults to the
      //   DynamicMessage implementation for MapEntrys which traditionally does
      //   not assume the presence of hasbits, so the default Python behavior
      //   for MapEntry messages (by default C++ implementations are not linked)
      //   will fall back to the DynamicMessage implementation and behave like
      //   implicit presence.
      // This is an inconsistency and this if-condition preserves it.
      //
      // Longer term, we want to get rid of this additional if-check of
      // IsMapEntryField. It might take one or more breaking changes and more
      // consensus gathering & clarification though.
      if (!field->has_presence() && IsMapEntryField(field)) {
        continue;
      }

      if (type_info->has_bits_offset == -1) {
        // At least one field in the message requires a hasbit, so allocate
        // hasbits.
        type_info->has_bits_offset = size;
        uint32_t* has_bits_indices = new uint32_t[type->field_count()];
        for (int j = 0; j < type->field_count(); j++) {
          // Initialize to -1, fields that need a hasbit will overwrite.
          has_bits_indices[j] = static_cast<uint32_t>(-1);
        }
        type_info->has_bits_indices.reset(has_bits_indices);
      }
      type_info->has_bits_indices[i] = max_hasbit++;
    }
  }

  if (max_hasbit > 0) {
    int has_bits_array_size = DivideRoundingUp(max_hasbit, bitsizeof(uint32_t));
    size += has_bits_array_size * sizeof(uint32_t);
    size = AlignOffset(size);
  }

  // The oneof_case, if any. It is an array of uint32s.
  if (real_oneof_count > 0) {
    type_info->oneof_case_offset = size;
    size += real_oneof_count * sizeof(uint32_t);
    size = AlignOffset(size);
  }

  // The ExtensionSet, if any.
  if (type->extension_range_count() > 0) {
    type_info->extensions_offset = size;
    size += sizeof(ExtensionSet);
    size = AlignOffset(size);
  } else {
    // No extensions.
    type_info->extensions_offset = -1;
  }

  // All the fields.
  //
  // TODO:  Optimize the order of fields to minimize padding.
  for (int i = 0; i < type->field_count(); i++) {
    // Make sure field is aligned to avoid bus errors.
    // Oneof fields do not use any space.
    if (!InRealOneof(type->field(i))) {
      int field_size = FieldSpaceUsed(type->field(i));
      size = AlignTo(size, std::min(kSafeAlignment, field_size));
      offsets[i] = size;
      size += field_size;
    }
  }

  // The oneofs.
  for (int i = 0; i < type->real_oneof_decl_count(); i++) {
    size = AlignTo(size, kSafeAlignment);
    offsets[type->field_count() + i] = size;
    size += kMaxOneofUnionSize;
  }

  type_info->weak_field_map_offset = -1;

  type_info->class_data.message_creator =
      internal::MessageCreator(DynamicMessage::NewImpl, size, kSafeAlignment);

  // Construct the reflection object.

  // Compute the size of default oneof instance and offsets of default
  // oneof fields.
  for (int i = 0; i < type->real_oneof_decl_count(); i++) {
    for (int j = 0; j < type->real_oneof_decl(i)->field_count(); j++) {
      const FieldDescriptor* field = type->real_oneof_decl(i)->field(j);
      // oneof fields are not accessed through offsets, but we still have the
      // entry for each.
      // Mark the field to prevent unintentional access through reflection.
      // Don't use the top bit because that is for unused fields.
      offsets[field->index()] = internal::kInvalidFieldOffsetTag;
    }
  }

  // Allocate the prototype fields.
  void* base = operator new(size);
  memset(base, 0, size);

  // We have already locked the factory so we should not lock in the constructor
  // of dynamic message to avoid dead lock.
  DynamicMessage* prototype = new (base) DynamicMessage(type_info, false);

  internal::ReflectionSchema schema = {
      static_cast<const Message*>(type_info->class_data.prototype),
      type_info->offsets.get(),
      type_info->has_bits_indices.get(),
      type_info->has_bits_offset,
      type_info->extensions_offset,
      type_info->oneof_case_offset,
      static_cast<int>(type_info->class_data.allocation_size()),
      type_info->weak_field_map_offset,
      nullptr,  // inlined_string_indices_
      0,        // inlined_string_donated_offset_
      -1,       // split_offset_
      -1,       // sizeof_split_
  };

  type_info->class_data.reflection = new Reflection(
      type_info->class_data.descriptor, schema, type_info->pool, this);

  // Cross link prototypes.
  prototype->CrossLinkPrototypes();

  return prototype;
}